

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpmOld.c
# Opt level: O1

Gia_Man_t * Gia_ManDupIn2Ff(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *p_01;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  
  iVar17 = p->vCis->nSize - p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar17 - 1U) {
    iVar4 = iVar17;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar5;
  p_01 = Gia_ManStart(iVar17 * 2 + p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_01->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_01->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar11 <= lVar15) goto LAB_0061d7f2;
      if ((pVVar10->pArray[lVar15] < 0) || (p->nObjs <= pVVar10->pArray[lVar15])) goto LAB_0061d7b4;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_01);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_01->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_01->nObjs <= pGVar8)) goto LAB_0061d7d3;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_01->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_01->nObjs <= pGVar8)) goto LAB_0061d7d3;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556);
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCis;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)(uVar11 - (long)p->nRegs));
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar17 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar12 = (iVar1 - iVar4) + iVar17;
      if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_0061d7f2;
      iVar4 = p->vCis->pArray[uVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0061d7b4;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar11 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) goto LAB_0061d7d3;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) goto LAB_0061d7d3;
      pGVar3[iVar4].Value = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
      iVar17 = iVar17 + 1;
      iVar4 = p->nRegs;
    } while (iVar17 < iVar4);
  }
  pVVar10 = p->vCis;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar11 <= lVar15) goto LAB_0061d7f2;
      iVar4 = pVVar10->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0061d7b4;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_01);
      uVar11 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) {
LAB_0061d7d3:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_01->pObjs;
      if ((pGVar9 < pGVar8) || (pGVar8 + p_01->nObjs <= pGVar9)) goto LAB_0061d7d3;
      pGVar3[iVar4].Value = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCis;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)(uVar11 - (long)p->nRegs));
  }
  if (0 < p->nObjs) {
    lVar15 = 8;
    lVar16 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar12 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar13 = *(uint *)((long)pGVar3 +
                              lVar15 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_0061d811;
        iVar4 = Gia_ManAppendAnd(p_01,uVar12 ^ (uint)(uVar11 >> 0x1d) & 1,
                                 uVar13 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar4;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < p->nObjs);
  }
  pVVar10 = p->vCos;
  uVar11 = (ulong)(uint)pVVar10->nSize;
  if (p->nRegs < pVVar10->nSize) {
    lVar15 = 0;
    do {
      if ((int)uVar11 <= lVar15) goto LAB_0061d7f2;
      iVar4 = pVVar10->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0061d7b4;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar4;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
      goto LAB_0061d811;
      uVar12 = Gia_ManAppendCo(p_01,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar12;
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCos;
      uVar11 = (ulong)pVVar10->nSize;
    } while (lVar15 < (long)(uVar11 - (long)p->nRegs));
  }
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar17 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar12 = (iVar1 - iVar4) + iVar17;
      if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_0061d7f2;
      iVar4 = p->vCos->pArray[uVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0061d7b4;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar4;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_0061d811:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_01,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar12;
      iVar17 = iVar17 + 1;
      iVar4 = p->nRegs;
    } while (iVar17 < iVar4);
  }
  pVVar10 = p->vCis;
  uVar12 = pVVar10->nSize;
  uVar11 = (ulong)uVar12;
  uVar13 = uVar12 - p->nRegs;
  uVar14 = (ulong)uVar13;
  if (uVar13 != 0 && p->nRegs <= (int)uVar12) {
    lVar15 = 0;
    do {
      if ((int)uVar11 <= lVar15) {
LAB_0061d7f2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((pVVar10->pArray[lVar15] < 0) || (p->nObjs <= pVVar10->pArray[lVar15])) {
LAB_0061d7b4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= lVar15) goto LAB_0061d7f2;
      Gia_ManAppendCo(p_01,p_00->pArray[lVar15]);
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCis;
      uVar11 = (ulong)pVVar10->nSize;
      uVar14 = uVar11 - (long)p->nRegs;
    } while (lVar15 < (long)uVar14);
  }
  Gia_ManSetRegNum(p_01,(int)uVar14);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return p_01;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Specialized duplication.]

  Description [Replaces registers by PIs/POs and PIs by registers.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDupIn2Ff( Gia_Man_t * p )
{
    Vec_Int_t * vPiOuts;
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj;
    int i;
    vPiOuts = Vec_IntAlloc( Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) + 2 * Gia_ManPiNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        Vec_IntPush( vPiOuts, Gia_ManAppendCi(pNew) );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPi( p, pObj, i )
        Gia_ManAppendCo( pNew, Vec_IntEntry(vPiOuts, i) );
    Gia_ManSetRegNum( pNew, Gia_ManPiNum(p) );
    Vec_IntFree( vPiOuts );
    return pNew;
}